

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedConditionalDispatching::Run(AdvancedConditionalDispatching *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  int iVar4;
  int h;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Vector<float,_4> local_dc;
  uint local_cc;
  uint local_c8;
  int data_3;
  int data_2;
  GLuint data_1 [3];
  int data;
  char *local_90;
  char *glsl_cs;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedConditionalDispatching *this_local;
  
  glsl_fs = 
  "\nuniform float g_depth;\nuniform vec2[3] g_vertex = vec2[3](vec2(-1, -1), vec2(3, -1), vec2(-1, 3));\nvoid main() {\n  gl_Position = vec4(g_vertex[gl_VertexID], g_depth, 1);\n}"
  ;
  local_28 = 
  "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(0, 1, 0, 1);\n}";
  glsl_vs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\nuniform float g_depth;\nuniform vec2[3] g_vertex = vec2[3](vec2(-1, -1), vec2(3, -1), vec2(-1, 3));\nvoid main() {\n  gl_Position = vec4(g_vertex[gl_VertexID], g_depth, 1);\n}"
             ,&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(0, 1, 0, 1);\n}"
             ,(allocator<char> *)((long)&glsl_cs + 7));
  GVar2 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,&local_48,&local_80);
  this->m_program_vsfs = GVar2;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&glsl_cs + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program_vsfs);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program_vsfs,(bool *)0x0);
  if (bVar1) {
    local_90 = 
    "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  int g_output;\n};\nvoid main() {\n  atomicAdd(g_output, 1);\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,
               "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  int g_output;\n};\nvoid main() {\n  atomicAdd(g_output, 1);\n}"
               ,(allocator<char> *)((long)data_1 + 0xb));
    GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&data);
    this->m_program_cs = GVar2;
    std::__cxx11::string::~string((string *)&data);
    std::allocator<char>::~allocator((allocator<char> *)((long)data_1 + 0xb));
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program_cs);
    bVar1 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program_cs,(bool *)0x0);
    if (bVar1) {
      data_1[1] = 0;
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,4,data_1 + 1,0x88ea);
      _data_3 = 0x200000002;
      data_1[0] = 2;
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_dispatch_buffer);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,&data_3,0x88e4);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glGenQueries
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,this->m_query);
      glu::CallLogWrapper::glEnable
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xb71);
      glu::CallLogWrapper::glClear
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x4100);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program_vsfs);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glBeginQuery
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2f,this->m_query[0]);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_program_vsfs,"g_depth");
      glu::CallLogWrapper::glUniform1f
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0.0);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,0,3);
      glu::CallLogWrapper::glEndQuery
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2f);
      glu::CallLogWrapper::glBeginQuery
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2f,this->m_query[1]);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_program_vsfs,"g_depth");
      glu::CallLogWrapper::glUniform1f
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0.5);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,0,3);
      glu::CallLogWrapper::glEndQuery
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2f);
      glu::CallLogWrapper::glDisable
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xb71);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program_cs);
      glu::CallLogWrapper::glBeginConditionalRender
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_query[0],0x8e13);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,2,2);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x2000);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glEndConditionalRender
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x2000);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,4,&local_c8);
      if (local_c8 == 0x10) {
        glu::CallLogWrapper::glBeginConditionalRender
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_query[1],0x8e13);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,2,2,2);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x2000);
        glu::CallLogWrapper::glDispatchComputeIndirect
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glEndConditionalRender
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x2000);
        glu::CallLogWrapper::glGetBufferSubData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,4,&local_cc);
        if (local_cc != 0x10) {
          pRVar5 = deqp::Context::getRenderContext
                             ((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                              m_context);
          iVar4 = (*pRVar5->_vptr_RenderContext[4])();
          iVar4 = tcu::RenderTarget::getDepthBits((RenderTarget *)CONCAT44(extraout_var,iVar4));
          if (iVar4 != 0) {
            anon_unknown_0::Output("Data is %d should be 16.\n",(ulong)local_cc);
            return (long)&DAT_ffffffffffffffff;
          }
        }
        if (local_cc != 0x20) {
          pRVar5 = deqp::Context::getRenderContext
                             ((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                              m_context);
          iVar4 = (*pRVar5->_vptr_RenderContext[4])();
          iVar4 = tcu::RenderTarget::getDepthBits((RenderTarget *)CONCAT44(extraout_var_00,iVar4));
          if (iVar4 == 0) {
            anon_unknown_0::Output("Data is %d should be 32.\n",(ulong)local_cc);
            return (long)&DAT_ffffffffffffffff;
          }
        }
        iVar4 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
        h = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
        tcu::Vector<float,_4>::Vector(&local_dc,0.0,1.0,0.0,1.0);
        bVar1 = ComputeShaderBase::ValidateReadBuffer
                          (&this->super_ComputeShaderBase,0,0,iVar4,h,&local_dc);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          this_local = (AdvancedConditionalDispatching *)0x0;
        }
        else {
          this_local = (AdvancedConditionalDispatching *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output("Data is %d should be 16.\n",(ulong)local_c8);
        this_local = (AdvancedConditionalDispatching *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedConditionalDispatching *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedConditionalDispatching *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = NL
			"uniform float g_depth;" NL "uniform vec2[3] g_vertex = vec2[3](vec2(-1, -1), vec2(3, -1), vec2(-1, 3));" NL
			"void main() {" NL "  gl_Position = vec4(g_vertex[gl_VertexID], g_depth, 1);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(0, 1, 0, 1);" NL "}";

		m_program_vsfs = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program_vsfs);
		if (!CheckProgram(m_program_vsfs))
			return ERROR;

		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL "  int g_output;" NL "};" NL
			   "void main() {" NL "  atomicAdd(g_output, 1);" NL "}";
		m_program_cs = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program_cs);
		if (!CheckProgram(m_program_cs))
			return ERROR;

		/* create storage buffer */
		{
			const int data = 0;
			glGenBuffers(1, &m_storage_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_DYNAMIC_COPY);
		}
		/* create dispatch buffer */
		{
			const GLuint data[3] = { 2, 2, 2 };
			glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glGenQueries(2, m_query);

		glEnable(GL_DEPTH_TEST);
		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

		glUseProgram(m_program_vsfs);
		glBindVertexArray(m_vertex_array);

		// this draw call will pass depth test
		glBeginQuery(GL_ANY_SAMPLES_PASSED, m_query[0]);
		glUniform1f(glGetUniformLocation(m_program_vsfs, "g_depth"), 0.0f);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndQuery(GL_ANY_SAMPLES_PASSED);

		// this draw call will NOT pass depth test
		glBeginQuery(GL_ANY_SAMPLES_PASSED, m_query[1]);
		glUniform1f(glGetUniformLocation(m_program_vsfs, "g_depth"), 0.5f);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndQuery(GL_ANY_SAMPLES_PASSED);

		glDisable(GL_DEPTH_TEST);

		glUseProgram(m_program_cs);

		// these commands should be executed normally
		glBeginConditionalRender(m_query[0], GL_QUERY_WAIT);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDispatchComputeIndirect(0);
		glEndConditionalRender();

		/* validate */
		{
			int data;
			glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
			if (data != 16)
			{
				Output("Data is %d should be 16.\n", data);
				return ERROR;
			}
		}

		// these commands should be discarded
		glBeginConditionalRender(m_query[1], GL_QUERY_WAIT);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDispatchComputeIndirect(0);
		glEndConditionalRender();

		/* validate */
		{
			int data;
			glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
			if (data != 16 && m_context.getRenderContext().getRenderTarget().getDepthBits() != 0)
			{
				Output("Data is %d should be 16.\n", data);
				return ERROR;
			}
			else if (data != 32 && m_context.getRenderContext().getRenderTarget().getDepthBits() == 0)
			{
				Output("Data is %d should be 32.\n", data);
				return ERROR;
			}
		}

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}